

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

cmCommand * __thiscall cmCTestAddSubdirectoryCommand::Clone(cmCTestAddSubdirectoryCommand *this)

{
  cmCTestAddSubdirectoryCommand *this_00;
  cmCTestAddSubdirectoryCommand *c;
  cmCTestAddSubdirectoryCommand *this_local;
  
  this_00 = (cmCTestAddSubdirectoryCommand *)operator_new(0x58);
  cmCTestAddSubdirectoryCommand(this_00);
  this_00->TestHandler = this->TestHandler;
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
    {
    cmCTestAddSubdirectoryCommand* c = new cmCTestAddSubdirectoryCommand;
    c->TestHandler = this->TestHandler;
    return c;
    }